

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

void HandleTargetOutcome(bool success)

{
  byte in_DIL;
  byte local_1;
  
  local_1 = in_DIL & 1;
  if (TargetOffloadPolicy == tgt_disabled) {
    if (local_1 != 0) {
      fprintf(_stderr,"Libomptarget fatal error %d: %s\n",1,
              "expected no offloading while offloading is disabled");
      exit(1);
    }
  }
  else {
    if (TargetOffloadPolicy == tgt_default) {
      fprintf(_stderr,"Libomptarget fatal error %d: %s\n",1,
              "default offloading policy must be switched to mandatory or disabled");
      exit(1);
    }
    if ((TargetOffloadPolicy == tgt_mandatory) && (local_1 == 0)) {
      fprintf(_stderr,"Libomptarget fatal error %d: %s\n",1,
              "failure of target construct while offloading is mandatory");
      exit(1);
    }
  }
  return;
}

Assistant:

static void HandleTargetOutcome(bool success) {
  switch (TargetOffloadPolicy) {
    case tgt_disabled:
      if (success) {
        FATAL_MESSAGE0(1, "expected no offloading while offloading is disabled");
      }
      break;
    case tgt_default:
      FATAL_MESSAGE0(1, "default offloading policy must be switched to "
                        "mandatory or disabled");
      break;
    case tgt_mandatory:
      if (!success) {
        FATAL_MESSAGE0(1, "failure of target construct while offloading is mandatory");
      }
      break;
  }
}